

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  ImGuiWindow *this_00;
  ImGuiListClipper *in_RDI;
  bool bVar1;
  float count;
  float items_height;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_ffffffffffffffd8;
  bool local_1;
  
  this_00 = GImGui->CurrentWindow;
  if ((in_RDI->ItemsCount == 0) || ((this_00->SkipItems & 1U) != 0)) {
    in_RDI->ItemsCount = -1;
    local_1 = false;
  }
  else if (in_RDI->StepNo == 0) {
    in_RDI->DisplayStart = 0;
    in_RDI->DisplayEnd = 1;
    in_RDI->StartPosY = (this_00->DC).CursorPos.y;
    in_RDI->StepNo = 1;
    local_1 = true;
  }
  else if (in_RDI->StepNo == 1) {
    if (in_RDI->ItemsCount == 1) {
      in_RDI->ItemsCount = -1;
      local_1 = false;
    }
    else {
      count = (this_00->DC).CursorPos.y - in_RDI->StartPosY;
      if (count <= 0.0) {
        __assert_fail("items_height > 0.0f",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                      ,0x920,"bool ImGuiListClipper::Step()");
      }
      Begin((ImGuiListClipper *)this_00,(int)count,in_stack_ffffffffffffffd8);
      in_RDI->DisplayStart = in_RDI->DisplayStart + 1;
      in_RDI->DisplayEnd = in_RDI->DisplayEnd + 1;
      in_RDI->StepNo = 3;
      local_1 = true;
    }
  }
  else if (in_RDI->StepNo == 2) {
    bVar1 = false;
    if (-1 < in_RDI->DisplayStart) {
      bVar1 = -1 < in_RDI->DisplayEnd;
    }
    if (!bVar1) {
      __assert_fail("DisplayStart >= 0 && DisplayEnd >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x929,"bool ImGuiListClipper::Step()");
    }
    in_RDI->StepNo = 3;
    local_1 = true;
  }
  else {
    if (in_RDI->StepNo == 3) {
      End(in_RDI);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ItemsCount == 0 || window->SkipItems)
    {
        ItemsCount = -1;
        return false;
    }
    if (StepNo == 0) // Step 0: the clipper let you process the first element, regardless of it being visible or not, so we can measure the element height.
    {
        DisplayStart = 0;
        DisplayEnd = 1;
        StartPosY = window->DC.CursorPos.y;
        StepNo = 1;
        return true;
    }
    if (StepNo == 1) // Step 1: the clipper infer height from first element, calculate the actual range of elements to display, and position the cursor before the first element.
    {
        if (ItemsCount == 1) { ItemsCount = -1; return false; }
        float items_height = window->DC.CursorPos.y - StartPosY;
        IM_ASSERT(items_height > 0.0f);   // If this triggers, it means Item 0 hasn't moved the cursor vertically
        Begin(ItemsCount - 1, items_height);
        DisplayStart++;
        DisplayEnd++;
        StepNo = 3;
        return true;
    }
    if (StepNo == 2) // Step 2: dummy step only required if an explicit items_height was passed to constructor or Begin() and user still call Step(). Does nothing and switch to Step 3.
    {
        IM_ASSERT(DisplayStart >= 0 && DisplayEnd >= 0);
        StepNo = 3;
        return true;
    }
    if (StepNo == 3) // Step 3: the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd), advance the cursor to the end of the list and then returns 'false' to end the loop.
        End();
    return false;
}